

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtFont.h
# Opt level: O2

string * __thiscall
ft::Font::getFamilyNameOr(string *__return_storage_ptr__,Font *this,string *defaultName)

{
  char *pcVar1;
  allocator local_9;
  
  pcVar1 = this->face->family_name;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)defaultName);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getFamilyNameOr(const std::string& defaultName) const
    {
        if (!face->family_name)
            return defaultName;
        return std::string(face->family_name);
    }